

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

int __thiscall btConvexHullInternal::Rational128::compare(Rational128 *this,Rational128 *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Int128 dbnLow;
  Int128 nbdLow;
  Int128 dbnHigh;
  Int128 nbdHigh;
  
  iVar1 = this->sign;
  if (iVar1 != b->sign) {
    return iVar1 - b->sign;
  }
  if (iVar1 != 0) {
    if (this->isInt64 == true) {
      iVar1 = compare(b,(long)iVar1 * (this->numerator).low);
      iVar1 = -iVar1;
    }
    else {
      DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
                (this->numerator,b->denominator,&nbdLow,&nbdHigh);
      DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
                (this->denominator,b->numerator,&dbnLow,&dbnHigh);
      uVar4 = 0xffffffff;
      uVar3 = uVar4;
      if ((((dbnHigh.high <= nbdHigh.high) &&
           (uVar2 = 1, uVar3 = uVar2, nbdHigh.high <= dbnHigh.high)) &&
          (uVar3 = uVar4, dbnHigh.low <= nbdHigh.low)) &&
         (((uVar3 = uVar2, nbdHigh.low <= dbnHigh.low && (uVar3 = uVar4, dbnLow.high <= nbdLow.high)
           ) && ((uVar3 = uVar2, nbdLow.high <= dbnLow.high &&
                 (uVar3 = uVar4, dbnLow.low <= nbdLow.low)))))) {
        uVar3 = (uint)(dbnLow.low < nbdLow.low);
      }
      iVar1 = uVar3 * this->sign;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int btConvexHullInternal::Rational128::compare(const Rational128& b) const
{
	if (sign != b.sign)
	{
		return sign - b.sign;
	}
	else if (sign == 0)
	{
		return 0;
	}
	if (isInt64)
	{
		return -b.compare(sign * (int64_t) numerator.low);
	}

	Int128 nbdLow, nbdHigh, dbnLow, dbnHigh;
	DMul<Int128, uint64_t>::mul(numerator, b.denominator, nbdLow, nbdHigh);
	DMul<Int128, uint64_t>::mul(denominator, b.numerator, dbnLow, dbnHigh);

	int cmp = nbdHigh.ucmp(dbnHigh);
	if (cmp)
	{
		return cmp * sign;
	}
	return nbdLow.ucmp(dbnLow) * sign;
}